

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  vec<6U,_float> *p;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  tile_details *ptVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  uint32 uVar9;
  long lVar10;
  undefined8 *puVar11;
  uint16 uVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  ulong uVar23;
  float dist2;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  uVar20 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar23 = (ulong)(this->m_tiles).m_size;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar20;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar23 * data;
  uVar20 = ((data + 1) * uVar23) / uVar20;
  if (SUB164(auVar6 / auVar5,0) < (uint)uVar20) {
    uVar23 = SUB168(auVar6 / auVar5,0) & 0xffffffff;
    do {
      ptVar4 = (this->m_tiles).m_p;
      if (ptVar4[uVar23].pixels.m_size != 0) {
        p = &ptVar4[uVar23].color_endpoint;
        if (*(int *)((long)pData_ptr + 0x80) == 0) {
          lVar10 = *(long *)((long)pData_ptr + 0x68);
LAB_00176d00:
          uVar18 = (ulong)*(uint *)((long)pData_ptr + 0x70);
        }
        else {
          uVar9 = fast_hash(p,0x18);
          uVar14 = uVar9 * -0x61c88647 >> (*(byte *)((long)pData_ptr + 0x78) & 0x1f);
          uVar18 = (ulong)uVar14;
          lVar10 = *(long *)((long)pData_ptr + 0x68);
          lVar16 = uVar18 * 0x20;
          if (*(char *)(lVar10 + 0x1c + lVar16) == '\0') goto LAB_00176d00;
          if (*(float *)(lVar10 + lVar16) != p->m_s[0]) {
LAB_00176cdc:
            uVar19 = *(int *)((long)pData_ptr + 0x70) - 1;
            uVar18 = (ulong)(uVar14 - 1);
            if (uVar14 == 0) {
              uVar18 = (ulong)uVar19;
            }
            if ((uint)uVar18 != uVar14) {
              pfVar22 = (float *)((ulong)uVar19 * 0x20 + lVar10);
              pfVar13 = (float *)(lVar10 + lVar16) + -8;
              if (uVar14 == 0) {
                pfVar13 = pfVar22;
              }
              do {
                if (*(char *)(pfVar13 + 7) == '\0') break;
                iVar15 = (int)uVar18;
                if (p->m_s[0] == *pfVar13) {
                  uVar17 = 0xffffffffffffffff;
                  lVar16 = 0;
                  do {
                    if (uVar17 == 4) goto LAB_00176d68;
                    lVar21 = uVar17 + 2;
                    uVar17 = uVar17 + 1;
                    lVar1 = lVar16 + 1;
                    lVar16 = lVar16 + 1;
                  } while (pfVar13[lVar21] == p->m_s[lVar1]);
                  if (4 < uVar17) goto LAB_00176d68;
                }
                uVar7 = iVar15 - 1;
                if (iVar15 == 0) {
                  uVar7 = uVar19;
                }
                uVar18 = (ulong)uVar7;
                pfVar13 = pfVar13 + -8;
                if (iVar15 == 0) {
                  pfVar13 = pfVar22;
                }
              } while (uVar7 != uVar14);
            }
            goto LAB_00176d00;
          }
          uVar17 = 0xffffffffffffffff;
          lVar21 = 0;
          do {
            if (uVar17 == 4) goto LAB_00176d68;
            lVar1 = uVar17 * 4;
            uVar17 = uVar17 + 1;
            lVar8 = lVar21 + 1;
            lVar21 = lVar21 + 1;
          } while (*(float *)(lVar10 + lVar16 + 8 + lVar1) == p->m_s[lVar8]);
          if (uVar17 < 5) goto LAB_00176cdc;
        }
LAB_00176d68:
        fVar24 = 0.0;
        lVar16 = 0;
        do {
          fVar25 = *(float *)(*(long *)((long)pData_ptr + 0x98) +
                              (ulong)*(uint *)(lVar10 + 0x18 + uVar18 * 0x20) * 0x18 + lVar16 * 4) -
                   p->m_s[lVar16];
          fVar24 = fVar24 + fVar25 * fVar25;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        uVar18 = 0;
        uVar12 = 0;
        if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
          uVar2 = *(undefined8 *)ptVar4[uVar23].color_endpoint.m_s;
          puVar11 = (undefined8 *)(*(long *)((long)pData_ptr + 0x98) + 0x10);
          uVar17 = 0;
          fVar25 = 1e+37;
          do {
            fVar26 = (float)puVar11[-2] - (float)uVar2;
            fVar27 = (float)((ulong)puVar11[-2] >> 0x20) - (float)((ulong)uVar2 >> 0x20);
            fVar26 = fVar27 * fVar27 + fVar26 * fVar26;
            if (((fVar26 <= fVar24) &&
                (uVar3 = *(undefined8 *)(ptVar4[uVar23].color_endpoint.m_s + 2),
                fVar27 = (float)puVar11[-1] - (float)uVar3,
                fVar28 = (float)((ulong)puVar11[-1] >> 0x20) - (float)((ulong)uVar3 >> 0x20),
                fVar26 = fVar28 * fVar28 + fVar27 * fVar27 + fVar26, fVar26 <= fVar24)) &&
               (uVar3 = *(undefined8 *)(ptVar4[uVar23].color_endpoint.m_s + 4),
               fVar27 = (float)*puVar11 - (float)uVar3,
               fVar28 = (float)((ulong)*puVar11 >> 0x20) - (float)((ulong)uVar3 >> 0x20),
               fVar26 = fVar28 * fVar28 + fVar26 + fVar27 * fVar27, fVar26 < fVar25)) {
              if (fVar26 == 0.0) {
                uVar12 = (uint16)uVar17;
                break;
              }
              uVar18 = uVar17 & 0xffffffff;
              fVar25 = fVar26;
            }
            uVar12 = (uint16)uVar18;
            uVar17 = uVar17 + 1;
            puVar11 = puVar11 + 3;
          } while (*(uint *)((long)pData_ptr + 0xa0) != uVar17);
        }
        (this->m_tiles).m_p[uVar23].cluster_indices[0] = uVar12;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < (uVar20 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
  const crnlib::vector<vec6F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      const vec6F& v = m_tiles[t].color_endpoint;
      float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
      float best_dist = math::cNearlyInfinite;
      uint best_index = 0;
      for (uint i = 0; i < codebook.size(); i++) {
        const vec6F& c = codebook[i];
        float dist = 0;
        float d0 = c[0] - v[0]; dist += d0 * d0;
        float d1 = c[1] - v[1]; dist += d1 * d1;
        if (dist > node_dist)
          continue;
        float d2 = c[2] - v[2]; dist += d2 * d2;
        float d3 = c[3] - v[3]; dist += d3 * d3;
        if (dist > node_dist)
          continue;
        float d4 = c[4] - v[4]; dist += d4 * d4;
        float d5 = c[5] - v[5]; dist += d5 * d5;
        if (dist < best_dist) {
          best_dist = dist;
          best_index = i;
          if (best_dist == 0.0f)
            break;
        }
      }
      m_tiles[t].cluster_indices[cColor] = best_index;
    }
  }
}